

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

int __thiscall rapic::client::poll(client *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  runtime_error *this_00;
  undefined4 in_register_0000000c;
  pollfd fds;
  undefined4 in_stack_ffffffffffffffc0;
  pollfd local_24 [3];
  int local_c;
  client *local_8;
  
  local_c = (int)__fds;
  local_8 = this;
  if (this->state_ == disconnected) {
    this_00 = (runtime_error *)
              __cxa_allocate_exception(0x10,__fds,__nfds,CONCAT44(in_register_0000000c,__timeout));
    std::runtime_error::runtime_error(this_00,"rapic: attempt to poll while disconnected");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_24[0].fd = this->socket_;
  bVar1 = poll_read(this);
  uVar2 = bVar1 | 0x2000;
  bVar1 = poll_write((client *)((ulong)CONCAT14(bVar1,in_stack_ffffffffffffffc0) | 0x200000000000));
  local_24[0].events = 0;
  if (bVar1) {
    local_24[0].events = 4;
  }
  local_24[0].events = uVar2 | local_24[0].events;
  iVar3 = ::poll(local_24,1,local_c);
  return iVar3;
}

Assistant:

auto client::poll(int timeout) const -> void
{
  if (state_ == rapic::connection_state::disconnected)
    throw std::runtime_error{"rapic: attempt to poll while disconnected"};

  struct pollfd fds;
  fds.fd = socket_;
  fds.events = POLLRDHUP | (poll_read() ? POLLIN : 0) | (poll_write() ? POLLOUT : 0);
  ::poll(&fds, 1, timeout);
}